

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uppity.c
# Opt level: O2

_Bool longoptarg(char *arg,char *expected,char **val,int *argcp,char ***argvp)

{
  char **ppcVar1;
  _Bool _Var2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  
  sVar4 = strlen(expected);
  sVar4 = (size_t)(int)sVar4;
  iVar3 = bcmp(arg,expected,sVar4);
  if (iVar3 == 0) {
    if (arg[sVar4] == '\0') {
      iVar3 = *argcp;
      *argcp = iVar3 + -1;
      if (iVar3 < 2) {
        fprintf(_stderr,"%s: option %s expects an argument\n","Uppity",expected);
        exit(1);
      }
      ppcVar1 = *argvp;
      *argvp = ppcVar1 + 1;
      pcVar5 = ppcVar1[1];
    }
    else {
      if (arg[sVar4] != '=') goto LAB_001101a8;
      pcVar5 = arg + sVar4 + 1;
    }
    *val = pcVar5;
    _Var2 = true;
  }
  else {
LAB_001101a8:
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

static bool longoptarg(const char *arg, const char *expected,
                       const char **val, int *argcp, char ***argvp)
{
    int len = strlen(expected);
    if (memcmp(arg, expected, len))
        return false;
    if (arg[len] == '=') {
        *val = arg + len + 1;
        return true;
    } else if (arg[len] == '\0') {
        if (--*argcp > 0) {
            *val = *++*argvp;
            return true;
        } else {
            fprintf(stderr, "%s: option %s expects an argument\n",
                    appname, expected);
            exit(1);
        }
    }
    return false;
}